

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O0

int hts_idx_get_stat(hts_idx_t *idx,int tid,uint64_t *mapped,uint64_t *unmapped)

{
  kh_bin_t *h_00;
  khint_t kVar1;
  khint_t k;
  bidx_t *h;
  uint64_t *unmapped_local;
  uint64_t *mapped_local;
  int tid_local;
  hts_idx_t *idx_local;
  
  if (idx->fmt == 3) {
    *mapped = 0;
    *unmapped = 0;
    idx_local._4_4_ = -1;
  }
  else {
    h_00 = idx->bidx[tid];
    kVar1 = kh_get_bin(h_00,idx->n_bins + 1);
    if (kVar1 == h_00->n_buckets) {
      *mapped = 0;
      *unmapped = 0;
      idx_local._4_4_ = -1;
    }
    else {
      *mapped = h_00->vals[kVar1].list[1].u;
      *unmapped = h_00->vals[kVar1].list[1].v;
      idx_local._4_4_ = 0;
    }
  }
  return idx_local._4_4_;
}

Assistant:

int hts_idx_get_stat(const hts_idx_t* idx, int tid, uint64_t* mapped, uint64_t* unmapped)
{
    if ( idx->fmt == HTS_FMT_CRAI ) {
        *mapped = 0; *unmapped = 0;
        return -1;
    }

    bidx_t *h = idx->bidx[tid];
    khint_t k = kh_get(bin, h, META_BIN(idx));
    if (k != kh_end(h)) {
        *mapped = kh_val(h, k).list[1].u;
        *unmapped = kh_val(h, k).list[1].v;
        return 0;
    } else {
        *mapped = 0; *unmapped = 0;
        return -1;
    }
}